

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

bool unicodeVerticalWhitespace(uint c)

{
  bool bVar1;
  
  bVar1 = true;
  if (((3 < c - 10) && (1 < c - 0x2028)) && (c != 0x85)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool unicodeVerticalWhitespace (unsigned int c)
{
  return (c == 0x000A ||   // Common  Other, control  LF, Line feed
          c == 0x000B ||   // Common  Other, control  VT, Vertical Tab
          c == 0x000C ||   // Common  Other, control  FF, Form feed
          c == 0x000D ||   // Common  Other, control  CR, Carriage return
          c == 0x0085 ||   // Common  Other, control  NEL, Next line
          c == 0x2028 ||   // line separator  Common  Separator, line
          c == 0x2029);    // paragraph separator Common  Separator, paragraph
}